

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Field *field)

{
  PackedType PVar1;
  Type type;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  char local_19;
  
  if (field->mutable_ != Immutable) {
    std::__ostream_insert<char,std::char_traits<char>>(this->os,"(mut ",5);
  }
  PVar1 = field->packedType;
  type.id = (field->type).id;
  if (type.id == 2 || PVar1 == not_packed) {
    if (PVar1 == not_packed) {
      print(this,type);
    }
    else {
      if (PVar1 == i16) {
        poVar4 = this->os;
        pcVar3 = "i16";
        lVar2 = 3;
      }
      else {
        if (PVar1 != i8) {
          handle_unreachable("unexpected packed type",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                             ,0x7bf);
        }
        poVar4 = this->os;
        pcVar3 = "i8";
        lVar2 = 2;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
    }
    if (field->mutable_ != Immutable) {
      local_19 = ')';
      std::__ostream_insert<char,std::char_traits<char>>(this->os,&local_19,1);
    }
    return this->os;
  }
  __assert_fail("type == Type::i32 && \"unexpected type\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                ,0x20a,"bool wasm::Field::isPacked() const");
}

Assistant:

std::ostream& TypePrinter::print(const Field& field) {
  if (field.mutable_) {
    os << "(mut ";
  }
  if (field.isPacked()) {
    auto packedType = field.packedType;
    if (packedType == Field::PackedType::i8) {
      os << "i8";
    } else if (packedType == Field::PackedType::i16) {
      os << "i16";
    } else {
      WASM_UNREACHABLE("unexpected packed type");
    }
  } else {
    print(field.type);
  }
  if (field.mutable_) {
    os << ')';
  }
  return os;
}